

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::rc::Texture3D::sample4(Texture3D *this,Vec4 *output,Vec3 *packetTexcoords,float lodBias)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  int i;
  long lVar6;
  float *pfVar7;
  float *pfVar8;
  ulong uVar9;
  bool bVar10;
  uint uVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  Vec3 dFdy1;
  Vec3 dFdy0;
  Vec3 dFdx1;
  Vec3 dFdx0;
  float local_9c;
  float local_98;
  float local_80 [4];
  float local_70 [4];
  float local_60 [4];
  float local_50 [4];
  undefined8 local_40;
  undefined8 uStack_38;
  
  local_98 = 0.0;
  local_9c = 0.0;
  if ((this->m_view).m_numLevels < 1) {
    fVar12 = 0.0;
  }
  else {
    local_9c = (float)(((this->m_view).m_levels)->m_size).m_data[0];
    local_98 = (float)(((this->m_view).m_levels)->m_size).m_data[1];
    fVar12 = (float)(((this->m_view).m_levels)->m_size).m_data[2];
  }
  local_50[2] = 0.0;
  local_50[0] = 0.0;
  local_50[1] = 0.0;
  lVar6 = 0;
  do {
    local_50[lVar6] = packetTexcoords[1].m_data[lVar6] - packetTexcoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_60[2] = 0.0;
  local_60[0] = 0.0;
  local_60[1] = 0.0;
  lVar6 = 0;
  do {
    local_60[lVar6] = packetTexcoords[3].m_data[lVar6] - packetTexcoords[2].m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_70[2] = 0.0;
  local_70[0] = 0.0;
  local_70[1] = 0.0;
  lVar6 = 0;
  do {
    local_70[lVar6] = packetTexcoords[2].m_data[lVar6] - packetTexcoords->m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  local_80[2] = 0.0;
  local_80[0] = 0.0;
  local_80[1] = 0.0;
  lVar6 = 0;
  do {
    local_80[lVar6] = packetTexcoords[3].m_data[lVar6] - packetTexcoords[1].m_data[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  fVar5 = local_50[0];
  fVar4 = local_60[0];
  fVar3 = local_70[0];
  fVar2 = local_80[0];
  pfVar8 = packetTexcoords->m_data + 2;
  uVar9 = 0;
  do {
    fVar13 = fVar5;
    if (1 < uVar9) {
      fVar13 = fVar4;
    }
    pfVar7 = local_60;
    if (1 >= uVar9) {
      pfVar7 = local_50;
    }
    bVar10 = (uVar9 & 1) != 0;
    fVar17 = fVar3;
    if (bVar10) {
      fVar17 = fVar2;
    }
    fVar14 = -fVar13;
    if (-fVar13 <= fVar13) {
      fVar14 = fVar13;
    }
    fVar13 = -fVar17;
    if (-fVar17 <= fVar17) {
      fVar13 = fVar17;
    }
    fVar17 = pfVar7[1];
    fVar15 = pfVar7[2];
    pfVar7 = local_80;
    if (!bVar10) {
      pfVar7 = local_70;
    }
    fVar16 = -fVar17;
    if (-fVar17 <= fVar17) {
      fVar16 = fVar17;
    }
    fVar17 = pfVar7[1];
    fVar1 = pfVar7[2];
    fVar18 = -fVar17;
    if (-fVar17 <= fVar17) {
      fVar18 = fVar17;
    }
    fVar17 = -fVar15;
    if (-fVar15 <= fVar15) {
      fVar17 = fVar15;
    }
    fVar15 = -fVar1;
    if (-fVar1 <= fVar1) {
      fVar15 = fVar1;
    }
    fVar13 = (float)(~-(uint)(fVar13 <= fVar14) & (uint)fVar13 |
                    (uint)fVar14 & -(uint)(fVar13 <= fVar14)) * local_9c;
    fVar14 = (float)(~-(uint)(fVar18 <= fVar16) & (uint)fVar18 |
                    (uint)fVar16 & -(uint)(fVar18 <= fVar16)) * local_98;
    uVar11 = -(uint)(fVar14 <= fVar13);
    fVar13 = (float)(~uVar11 & (uint)fVar14 | (uint)fVar13 & uVar11);
    fVar17 = (float)(~-(uint)(fVar15 <= fVar17) & (uint)fVar15 |
                    (uint)fVar17 & -(uint)(fVar15 <= fVar17)) * fVar12;
    uVar11 = -(uint)(fVar17 <= fVar13);
    fVar13 = logf((float)(~uVar11 & (uint)fVar17 | uVar11 & (uint)fVar13));
    tcu::sampleLevelArray3D
              ((tcu *)&local_40,(this->m_view).m_levels,(this->m_view).m_numLevels,
               &(this->super_Texture).m_sampler,((Vec3 *)(pfVar8 + -2))->m_data[0],pfVar8[-1],
               *pfVar8,fVar13 * 1.442695 + lodBias);
    *(undefined8 *)output->m_data = local_40;
    *(undefined8 *)(output->m_data + 2) = uStack_38;
    uVar9 = uVar9 + 1;
    output = output + 1;
    pfVar8 = pfVar8 + 3;
  } while (uVar9 != 4);
  return;
}

Assistant:

void Texture3D::sample4 (tcu::Vec4 output[4], const tcu::Vec3 packetTexcoords[4], float lodBias) const
{
	const float texWidth  = (float)m_view.getWidth();
	const float texHeight = (float)m_view.getHeight();
	const float texDepth  = (float)m_view.getDepth();

	const tcu::Vec3 dFdx0 = packetTexcoords[1] - packetTexcoords[0];
	const tcu::Vec3 dFdx1 = packetTexcoords[3] - packetTexcoords[2];
	const tcu::Vec3 dFdy0 = packetTexcoords[2] - packetTexcoords[0];
	const tcu::Vec3 dFdy1 = packetTexcoords[3] - packetTexcoords[1];

	for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
	{
		const tcu::Vec3& dFdx = (fragNdx & 2) ? dFdx1 : dFdx0;
		const tcu::Vec3& dFdy = (fragNdx & 1) ? dFdy1 : dFdy0;

		const float mu = de::max(de::abs(dFdx.x()), de::abs(dFdy.x()));
		const float mv = de::max(de::abs(dFdx.y()), de::abs(dFdy.y()));
		const float mw = de::max(de::abs(dFdx.z()), de::abs(dFdy.z()));
		const float p = de::max(de::max(mu * texWidth, mv * texHeight), mw * texDepth);

		const float	lod = deFloatLog2(p) + lodBias;

		output[fragNdx] = sample(packetTexcoords[fragNdx].x(), packetTexcoords[fragNdx].y(), packetTexcoords[fragNdx].z(), lod);
	}
}